

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_time.h
# Opt level: O2

date_time_period * __thiscall
booster::locale::date_time_period_set::operator[](date_time_period_set *this,size_t n)

{
  size_t sVar1;
  date_time_period *pdVar2;
  out_of_range *this_00;
  allocator local_39;
  string local_38;
  
  sVar1 = size(this);
  if (n < sVar1) {
    pdVar2 = (date_time_period *)(*(long *)(this + 0x20) + -0x20 + n * 8);
    if (n < 4) {
      pdVar2 = (date_time_period *)(this + n * 8);
    }
    return pdVar2;
  }
  this_00 = (out_of_range *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)&local_38,"Invalid index to date_time_period",&local_39);
  out_of_range::out_of_range(this_00,&local_38);
  __cxa_throw(this_00,&out_of_range::typeinfo,out_of_range::~out_of_range);
}

Assistant:

date_time_period const &operator[](size_t n) const 
            {
                if(n >= size())
                    throw booster::out_of_range("Invalid index to date_time_period");
                if(n < 4)
                    return basic_[n];
                else
                    return periods_[n-4];
            }